

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_kmgmt.c
# Opt level: O0

OSSL_PARAM * ec_imexport_types(int selection)

{
  int type_select;
  int selection_local;
  
  type_select = (int)((selection & 1U) != 0);
  if ((selection & 2U) != 0) {
    type_select = type_select + 2;
  }
  if ((selection & 4U) != 0) {
    type_select = type_select + 4;
  }
  if ((selection & 0x80U) != 0) {
    type_select = type_select + 8;
  }
  return ec_types[type_select];
}

Assistant:

static ossl_inline
const OSSL_PARAM *ec_imexport_types(int selection)
{
    int type_select = 0;

    if ((selection & OSSL_KEYMGMT_SELECT_PRIVATE_KEY) != 0)
        type_select += 1;
    if ((selection & OSSL_KEYMGMT_SELECT_PUBLIC_KEY) != 0)
        type_select += 2;
    if ((selection & OSSL_KEYMGMT_SELECT_DOMAIN_PARAMETERS) != 0)
        type_select += 4;
    if ((selection & OSSL_KEYMGMT_SELECT_OTHER_PARAMETERS) != 0)
        type_select += 8;
    return ec_types[type_select];
}